

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O0

uint64_t __thiscall
XPMP2::SoundSystemFMOD::Play(SoundSystemFMOD *this,string *sndName,float vol,Aircraft *ac)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  pointer pSVar4;
  runtime_error *prVar5;
  FMOD_SOUND *pFVar6;
  undefined8 uVar7;
  Aircraft *in_RDX;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  FmodError *e;
  runtime_error *e_1;
  SoundChannel *pChn;
  SoundFMOD *pSndFmod;
  SoundFilePtr *pSnd;
  uint64_t sndId;
  FMOD_CHANNEL *pFmodChn;
  FmodError *in_stack_fffffffffffff7f0;
  pair<unsigned_long,_XPMP2::SoundChannel_*> *in_stack_fffffffffffff7f8;
  tuple<unsigned_long_&,_XPMP2::SoundChannel_*&> *in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
  *in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff824;
  int iVar8;
  allocator<char> *in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff830;
  int in_stack_fffffffffffff834;
  undefined4 in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff84c;
  undefined8 in_stack_fffffffffffff850;
  float vol_00;
  long lVar9;
  undefined7 in_stack_fffffffffffff858;
  undefined1 in_stack_fffffffffffff85f;
  SoundSystem *in_stack_fffffffffffff860;
  int iVar10;
  undefined4 in_stack_fffffffffffff868;
  int in_stack_fffffffffffff86c;
  undefined8 in_stack_fffffffffffff870;
  FMOD_RESULT _r;
  string *in_stack_fffffffffffff878;
  undefined4 in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff884;
  int iVar11;
  SoundFMOD *local_660;
  allocator<char> local_619;
  string local_618 [39];
  allocator<char> local_5f1;
  string local_5f0 [39];
  allocator<char> local_5c9;
  string local_5c8 [135];
  allocator<char> local_541;
  string local_540 [39];
  allocator<char> local_519;
  string local_518 [39];
  allocator<char> local_4f1;
  string local_4f0 [135];
  allocator<char> local_469;
  string local_468 [39];
  allocator<char> local_441;
  string local_440 [39];
  undefined1 local_419 [136];
  allocator<char> local_391;
  string local_390 [39];
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [135];
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [39];
  allocator<char> local_269;
  string local_268 [134];
  undefined1 local_1e2;
  undefined1 local_16a;
  pair<unsigned_long,_XPMP2::SoundChannel_*> local_e8;
  long local_d8;
  undefined1 local_ca;
  SoundFMOD *local_58;
  mapped_type *local_40;
  uint64_t local_38;
  long local_30;
  Aircraft *local_28;
  undefined4 local_1c;
  
  _r = (FMOD_RESULT)((ulong)in_stack_fffffffffffff870 >> 0x20);
  vol_00 = (float)((ulong)in_stack_fffffffffffff850 >> 0x20);
  local_30 = 0;
  local_38 = 0;
  local_28 = in_RDX;
  local_1c = in_XMM0_Da;
  local_40 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
             ::at(in_stack_fffffffffffff810,
                  (key_type *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  pSVar4 = std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>::operator->
                     ((unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_> *)
                      0x37a868);
  uVar3 = (*pSVar4->_vptr_SoundFile[2])();
  if ((uVar3 & 1) == 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Sound not yet ready");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pSVar4 = std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>::get
                     ((unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_> *)
                      in_stack_fffffffffffff7f0);
  if (pSVar4 == (pointer)0x0) {
    local_660 = (SoundFMOD *)0x0;
  }
  else {
    local_660 = (SoundFMOD *)__dynamic_cast(pSVar4,&SoundFile::typeinfo,&SoundFMOD::typeinfo,0);
  }
  local_58 = local_660;
  if (local_660 == (SoundFMOD *)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Sound has not been loaded for FMOD system");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar9 = in_RDI[0x10];
  pFVar6 = SoundFMOD::GetSnd(local_660);
  gFmodRes = FMOD_System_PlaySound(lVar9,pFVar6,in_RDI[0x12],1,&local_30);
  if (gFmodRes != 0) {
    local_ca = 1;
    uVar7 = __cxa_allocate_exception(0x60);
    iVar10 = (int)((ulong)in_stack_fffffffffffff860 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
               (char *)in_stack_fffffffffffff828,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
               (char *)in_stack_fffffffffffff828,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
               (char *)in_stack_fffffffffffff828,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    FmodError::FmodError
              ((FmodError *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
               in_stack_fffffffffffff878,_r,
               (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),iVar10,
               (string *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858));
    local_ca = 0;
    __cxa_throw(uVar7,&FmodError::typeinfo,FmodError::~FmodError);
  }
  if (local_30 != 0) {
    local_d8 = 0;
    local_e8 = SoundSystem::AddChn(in_stack_fffffffffffff860,
                                   (SoundFile *)
                                   CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                                   vol_00,(FMOD_CHANNEL *)
                                          CONCAT44(in_stack_fffffffffffff84c,
                                                   in_stack_fffffffffffff848));
    iVar10 = (int)((ulong)in_stack_fffffffffffff860 >> 0x20);
    std::tie<unsigned_long,XPMP2::SoundChannel*>
              (&in_stack_fffffffffffff7f8->first,(SoundChannel **)in_stack_fffffffffffff7f0);
    std::tuple<unsigned_long&,XPMP2::SoundChannel*&>::operator=
              (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    if (local_d8 == 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"pChn is NULL");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    gFmodRes = FMOD_Channel_SetUserData(local_30,local_38);
    if (gFmodRes == 0) {
      gFmodRes = FMOD_Channel_SetCallback(local_30,ChnCB);
      if (gFmodRes == 0) {
        gFmodRes = FMOD_Channel_Set3DMinMaxDistance((float)local_28->sndMinDist,0x461c4000,local_30)
        ;
        if (gFmodRes != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     (char *)in_stack_fffffffffffff828,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     (char *)in_stack_fffffffffffff828,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     (char *)in_stack_fffffffffffff828,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          FmodError::FmodError
                    ((FmodError *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                     in_stack_fffffffffffff878,_r,
                     (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),iVar10,
                     (string *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858));
          FmodError::LogErr((FmodError *)
                            CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          FmodError::~FmodError(in_stack_fffffffffffff7f0);
          std::__cxx11::string::~string(local_2b8);
          std::allocator<char>::~allocator(&local_2b9);
          std::__cxx11::string::~string(local_290);
          std::allocator<char>::~allocator(&local_291);
          std::__cxx11::string::~string(local_268);
          std::allocator<char>::~allocator(&local_269);
        }
        bVar1 = SoundFile::hasConeInfo((SoundFile *)in_stack_fffffffffffff7f0);
        if (bVar1) {
          gFmodRes = FMOD_Channel_Set3DConeSettings
                               ((local_58->super_SoundFile).coneInAngle,
                                (local_58->super_SoundFile).coneOutAngle,
                                (local_58->super_SoundFile).coneOutVol,local_30);
          if (gFmodRes != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                       (char *)in_stack_fffffffffffff828,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                       (char *)in_stack_fffffffffffff828,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                       (char *)in_stack_fffffffffffff828,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
            FmodError::FmodError
                      ((FmodError *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                       in_stack_fffffffffffff878,_r,
                       (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                       iVar10,(string *)
                              CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858));
            FmodError::LogErr((FmodError *)
                              CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
            FmodError::~FmodError(in_stack_fffffffffffff7f0);
            std::__cxx11::string::~string(local_390);
            std::allocator<char>::~allocator(&local_391);
            std::__cxx11::string::~string(local_368);
            std::allocator<char>::~allocator(&local_369);
            std::__cxx11::string::~string(local_340);
            std::allocator<char>::~allocator(&local_341);
          }
        }
        (**(code **)(*in_RDI + 0x30))(in_RDI,local_38,local_28,1);
        gFmodRes = FMOD_Channel_SetVolume(local_1c,local_30);
        iVar11 = gFmodRes;
        if (gFmodRes != 0) {
          in_stack_fffffffffffff878 = (string *)local_419;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     (char *)in_stack_fffffffffffff828,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          _r = (FMOD_RESULT)((ulong)&local_441 >> 0x20);
          in_stack_fffffffffffff86c = gFmodRes;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     (char *)in_stack_fffffffffffff828,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          iVar10 = (int)((ulong)&local_469 >> 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     (char *)in_stack_fffffffffffff828,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          FmodError::FmodError
                    ((FmodError *)CONCAT44(iVar11,in_stack_fffffffffffff880),
                     in_stack_fffffffffffff878,_r,
                     (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),iVar10,
                     (string *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858));
          FmodError::LogErr((FmodError *)
                            CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          FmodError::~FmodError(in_stack_fffffffffffff7f0);
          std::__cxx11::string::~string(local_468);
          std::allocator<char>::~allocator(&local_469);
          std::__cxx11::string::~string(local_440);
          std::allocator<char>::~allocator(&local_441);
          std::__cxx11::string::~string((string *)(local_419 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_419);
        }
        lVar9 = local_30;
        uVar2 = Aircraft::SoundIsMuted(local_28);
        gFmodRes = FMOD_Channel_SetMute(lVar9,uVar2);
        if (gFmodRes != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     (char *)in_stack_fffffffffffff828,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          in_stack_fffffffffffff834 = gFmodRes;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     (char *)in_stack_fffffffffffff828,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          in_stack_fffffffffffff828 = &local_541;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     (char *)in_stack_fffffffffffff828,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          FmodError::FmodError
                    ((FmodError *)CONCAT44(iVar11,in_stack_fffffffffffff880),
                     in_stack_fffffffffffff878,_r,
                     (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),iVar10,
                     (string *)CONCAT17(uVar2,in_stack_fffffffffffff858));
          FmodError::LogErr((FmodError *)
                            CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          FmodError::~FmodError(in_stack_fffffffffffff7f0);
          std::__cxx11::string::~string(local_540);
          std::allocator<char>::~allocator(&local_541);
          std::__cxx11::string::~string(local_518);
          std::allocator<char>::~allocator(&local_519);
          std::__cxx11::string::~string(local_4f0);
          std::allocator<char>::~allocator(&local_4f1);
        }
        if ((*(byte *)(in_RDI + 0x13) & 1) != 0) {
          gFmodRes = FMOD_Channel_SetLowPassGain(0x3e4ccccd,local_30);
          if (gFmodRes != 0) {
            iVar8 = gFmodRes;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                       (char *)in_stack_fffffffffffff828,
                       (allocator<char> *)CONCAT44(iVar8,in_stack_fffffffffffff820));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                       (char *)in_stack_fffffffffffff828,
                       (allocator<char> *)CONCAT44(iVar8,in_stack_fffffffffffff820));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                       (char *)in_stack_fffffffffffff828,
                       (allocator<char> *)CONCAT44(iVar8,in_stack_fffffffffffff820));
            FmodError::FmodError
                      ((FmodError *)CONCAT44(iVar11,in_stack_fffffffffffff880),
                       in_stack_fffffffffffff878,_r,
                       (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                       iVar10,(string *)CONCAT17(uVar2,in_stack_fffffffffffff858));
            FmodError::LogErr((FmodError *)CONCAT44(iVar8,in_stack_fffffffffffff820));
            FmodError::~FmodError(in_stack_fffffffffffff7f0);
            std::__cxx11::string::~string(local_618);
            std::allocator<char>::~allocator(&local_619);
            std::__cxx11::string::~string(local_5f0);
            std::allocator<char>::~allocator(&local_5f1);
            std::__cxx11::string::~string(local_5c8);
            std::allocator<char>::~allocator(&local_5c9);
          }
        }
        return local_38;
      }
      local_1e2 = 1;
      uVar7 = __cxa_allocate_exception(0x60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                 (char *)in_stack_fffffffffffff828,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                 (char *)in_stack_fffffffffffff828,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                 (char *)in_stack_fffffffffffff828,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
      FmodError::FmodError
                ((FmodError *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                 in_stack_fffffffffffff878,_r,
                 (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),iVar10,
                 (string *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858));
      local_1e2 = 0;
      __cxa_throw(uVar7,&FmodError::typeinfo,FmodError::~FmodError);
    }
    local_16a = 1;
    uVar7 = __cxa_allocate_exception(0x60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
               (char *)in_stack_fffffffffffff828,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
               (char *)in_stack_fffffffffffff828,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
               (char *)in_stack_fffffffffffff828,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    FmodError::FmodError
              ((FmodError *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
               in_stack_fffffffffffff878,_r,
               (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),iVar10,
               (string *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858));
    local_16a = 0;
    __cxa_throw(uVar7,&FmodError::typeinfo,FmodError::~FmodError);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"FMOD_System_PlaySound returned NULL channel");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint64_t SoundSystemFMOD::Play (const std::string& sndName, float vol, const Aircraft& ac)
{
    FMOD_CHANNEL* pFmodChn = nullptr;
    uint64_t sndId = 0;

    // Find the sound a check if it is ready
    try {
        // find the sound, may throw if not found, return if sound isn't ready yet
        SoundFilePtr& pSnd = mapSounds.at(sndName);
        if (!pSnd->isReady()) throw std::runtime_error("Sound not yet ready");
        SoundFMOD* pSndFmod = dynamic_cast<SoundFMOD*>(pSnd.get());
        if (!pSndFmod) throw std::runtime_error("Sound has not been loaded for FMOD system");

        // Start playing the sound, but in a paused state to avoid crackling
        FMOD_TEST(FMOD_System_PlaySound(pFmodSystem, pSndFmod->GetSnd(), pChnGrp, true, &pFmodChn));
        if (!pFmodChn) throw std::runtime_error("FMOD_System_PlaySound returned NULL channel");
        
        // We must keep track of the sounds we produce so we can clean up after us
        SoundChannel* pChn = nullptr;
        std::tie(sndId, pChn) = AddChn(pSndFmod, vol, pFmodChn);
        if (!pChn) throw std::runtime_error("pChn is NULL");
        FMOD_TEST(FMOD_Channel_SetUserData(pFmodChn, (void*)sndId));// save internal sound id for later bookkeeping
        FMOD_TEST(FMOD_Channel_SetCallback(pFmodChn, ChnCB));       // set callback, this is essential for internal cleanup!
        
        // Set a few more parameters to the sound
        FMOD_LOG(FMOD_Channel_Set3DMinMaxDistance(pFmodChn, (float)ac.sndMinDist, FMOD_3D_MAX_DIST));
        if (pSndFmod->hasConeInfo()) {
            FMOD_LOG(FMOD_Channel_Set3DConeSettings(pFmodChn,
                                                    pSndFmod->coneInAngle,
                                                    pSndFmod->coneOutAngle,
                                                    pSndFmod->coneOutVol));
        }
        SetPosOrientation(sndId, ac, true);
        FMOD_LOG(FMOD_Channel_SetVolume(pFmodChn, vol));
        FMOD_LOG(FMOD_Channel_SetMute(pFmodChn, ac.SoundIsMuted()));
        if (bLowPass) {
            FMOD_LOG(FMOD_Channel_SetLowPassGain(pFmodChn, FMOD_LOW_PASS_GAIN));
        }

        // Success
        return sndId;
    }
    FMOD_CATCH
    catch (const std::runtime_error& e) {
        LOG_MSG(logERR, "Could not play sound '%s': %s",
                sndName.c_str(), e.what());
    }
    
    // So there was an error...we better remove the sound
    if (sndId)
        RemoveChn(sndId);
    
    return 0;
}